

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::DatePartFunction<duckdb::dtime_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  long *plVar4;
  idx_t count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  reference vector;
  reference vector_00;
  long lVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  idx_t i;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  data_ptr_t pdVar16;
  ulong uVar17;
  idx_t i_2;
  data_ptr_t pdVar18;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    plVar4 = (long *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      lVar8 = BinaryLambdaWrapperWithNulls::
              Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                        (*(undefined8 *)vector->data,*(undefined8 *)(vector->data + 8),
                         *(undefined8 *)vector_00->data);
      *plVar4 = lVar8;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar16 = vector->data;
      pdVar5 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar16 = pdVar16 + 8;
          for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
            lVar8 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                              (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                               *(undefined8 *)pdVar5);
            *(long *)(pdVar6 + iVar14 * 8) = lVar8;
            pdVar16 = pdVar16 + 0x10;
          }
          return;
        }
        uVar11 = 0;
        uVar13 = 0;
        do {
          if (uVar11 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar15 = count;
            }
LAB_01d8600c:
            pdVar18 = pdVar16 + uVar13 * 0x10 + 8;
            for (; uVar10 = uVar13, uVar13 < uVar15; uVar13 = uVar13 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                (*(undefined8 *)(pdVar18 + -8),*(undefined8 *)pdVar18,
                                 *(undefined8 *)pdVar5);
              *(long *)(pdVar6 + uVar13 * 8) = lVar8;
              pdVar18 = pdVar18 + 0x10;
            }
          }
          else {
            uVar7 = puVar3[uVar11];
            uVar15 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar15 = count;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_01d8600c;
            uVar10 = uVar15;
            if (uVar7 != 0) {
              pdVar18 = pdVar16 + uVar13 * 0x10 + 8;
              for (uVar17 = 0; uVar10 = uVar13 + uVar17, uVar13 + uVar17 < uVar15;
                  uVar17 = uVar17 + 1) {
                if ((uVar7 >> (uVar17 & 0x3f) & 1) != 0) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                    (*(undefined8 *)(pdVar18 + -8),*(undefined8 *)pdVar18,
                                     *(undefined8 *)pdVar5);
                  *(long *)(pdVar6 + uVar17 * 8 + uVar13 * 8) = lVar8;
                }
                pdVar18 = pdVar18 + 0x10;
              }
            }
          }
          uVar11 = uVar11 + 1;
          uVar13 = uVar10;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar16 = vector->data;
          pdVar5 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar6 = result->data;
          FlatVector::VerifyFlatVector(result);
          this = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          TemplatedValidityMask<unsigned_long>::Copy
                    (&this->super_TemplatedValidityMask<unsigned_long>,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>,count);
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          FlatVector::VerifyFlatVector(vector_00);
          if (puVar3 == (unsigned_long *)0x0) {
            TemplatedValidityMask<unsigned_long>::Copy
                      (&this->super_TemplatedValidityMask<unsigned_long>,
                       &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
          }
          else {
            ValidityMask::Combine(this,&vector_00->validity,count);
          }
          if ((this->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            pdVar16 = pdVar16 + 8;
            for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                (*(undefined8 *)(pdVar16 + -8),*(undefined8 *)pdVar16,
                                 *(undefined8 *)(pdVar5 + iVar14 * 8));
              *(long *)(pdVar6 + iVar14 * 8) = lVar8;
              pdVar16 = pdVar16 + 0x10;
            }
          }
          else {
            uVar13 = 0;
            for (uVar11 = 0; uVar11 != count + 0x3f >> 6; uVar11 = uVar11 + 1) {
              puVar3 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar15 = uVar13 + 0x40;
                if (count <= uVar13 + 0x40) {
                  uVar15 = count;
                }
LAB_01d86531:
                pdVar18 = pdVar16 + uVar13 * 0x10 + 8;
                for (; uVar10 = uVar13, uVar13 < uVar15; uVar13 = uVar13 + 1) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                    (*(undefined8 *)(pdVar18 + -8),*(undefined8 *)pdVar18,
                                     *(undefined8 *)(pdVar5 + uVar13 * 8));
                  *(long *)(pdVar6 + uVar13 * 8) = lVar8;
                  pdVar18 = pdVar18 + 0x10;
                }
              }
              else {
                uVar7 = puVar3[uVar11];
                uVar15 = uVar13 + 0x40;
                if (count <= uVar13 + 0x40) {
                  uVar15 = count;
                }
                if (uVar7 == 0xffffffffffffffff) goto LAB_01d86531;
                uVar10 = uVar15;
                if (uVar7 != 0) {
                  pdVar18 = pdVar16 + uVar13 * 0x10 + 8;
                  for (uVar17 = 0; uVar10 = uVar17 + uVar13, uVar17 + uVar13 < uVar15;
                      uVar17 = uVar17 + 1) {
                    if ((uVar7 >> (uVar17 & 0x3f) & 1) != 0) {
                      lVar8 = BinaryLambdaWrapperWithNulls::
                              Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                        (*(undefined8 *)(pdVar18 + -8),*(undefined8 *)pdVar18,
                                         *(undefined8 *)(pdVar5 + uVar17 * 8 + uVar13 * 8));
                      *(long *)(pdVar6 + uVar17 * 8 + uVar13 * 8) = lVar8;
                    }
                    pdVar18 = pdVar18 + 0x10;
                  }
                }
              }
              uVar13 = uVar10;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar16 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
              iVar9 = iVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar14];
              }
              iVar12 = iVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar12 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
              }
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                (*(undefined8 *)(ldata.data + iVar9 * 0x10),
                                 *(undefined8 *)(ldata.data + iVar9 * 0x10 + 8),
                                 *(undefined8 *)(local_c0.data + iVar12 * 8));
              *(long *)(pdVar16 + iVar14 * 8) = lVar8;
            }
          }
          else {
            for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
              iVar9 = iVar14;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar9 = (idx_t)(ldata.sel)->sel_vector[iVar14];
              }
              iVar12 = iVar14;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar12 = (idx_t)(local_c0.sel)->sel_vector[iVar14];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar9 >> 6] >> (iVar9 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)))) {
                lVar8 = BinaryLambdaWrapperWithNulls::
                        Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                  (*(undefined8 *)(ldata.data + iVar9 * 0x10),
                                   *(undefined8 *)(ldata.data + iVar9 * 0x10 + 8),
                                   *(undefined8 *)(local_c0.data + iVar12 * 8));
                *(long *)(pdVar16 + iVar14 * 8) = lVar8;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar16 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar5 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        TemplatedValidityMask<unsigned_long>::Copy
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>,count);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          for (iVar14 = 0; count != iVar14; iVar14 = iVar14 + 1) {
            lVar8 = BinaryLambdaWrapperWithNulls::
                    Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                              (*(undefined8 *)pdVar16,*(undefined8 *)(pdVar16 + 8),
                               *(undefined8 *)(pdVar5 + iVar14 * 8));
            *(long *)(pdVar6 + iVar14 * 8) = lVar8;
          }
          return;
        }
        uVar11 = 0;
        uVar13 = 0;
        do {
          if (uVar11 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar15 = count;
            }
LAB_01d862ae:
            for (; uVar10 = uVar13, uVar13 < uVar15; uVar13 = uVar13 + 1) {
              lVar8 = BinaryLambdaWrapperWithNulls::
                      Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                (*(undefined8 *)pdVar16,*(undefined8 *)(pdVar16 + 8),
                                 *(undefined8 *)(pdVar5 + uVar13 * 8));
              *(long *)(pdVar6 + uVar13 * 8) = lVar8;
            }
          }
          else {
            uVar7 = puVar3[uVar11];
            uVar15 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar15 = count;
            }
            if (uVar7 == 0xffffffffffffffff) goto LAB_01d862ae;
            uVar10 = uVar15;
            if (uVar7 != 0) {
              for (uVar17 = 0; uVar10 = uVar13 + uVar17, uVar13 + uVar17 < uVar15;
                  uVar17 = uVar17 + 1) {
                if ((uVar7 >> (uVar17 & 0x3f) & 1) != 0) {
                  lVar8 = BinaryLambdaWrapperWithNulls::
                          Operation<duckdb::DatePartFunction<duckdb::dtime_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)_1_,bool,duckdb::string_t,duckdb::dtime_t,long>
                                    (*(undefined8 *)pdVar16,*(undefined8 *)(pdVar16 + 8),
                                     *(undefined8 *)(pdVar5 + uVar17 * 8 + uVar13 * 8));
                  *(long *)(pdVar6 + uVar17 * 8 + uVar13 * 8) = lVar8;
                }
              }
            }
          }
          uVar11 = uVar11 + 1;
          uVar13 = uVar10;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void DatePartFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto &spec_arg = args.data[0];
	auto &date_arg = args.data[1];

	BinaryExecutor::ExecuteWithNulls<string_t, T, int64_t>(
	    spec_arg, date_arg, result, args.size(), [&](string_t specifier, T date, ValidityMask &mask, idx_t idx) {
		    if (Value::IsFinite(date)) {
			    return ExtractElement<T>(GetDatePartSpecifier(specifier.GetString()), date);
		    } else {
			    mask.SetInvalid(idx);
			    return int64_t(0);
		    }
	    });
}